

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::yml::Parser::_handle_seq_flow(Parser *this)

{
  code *pcVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  csubstr val;
  bool bVar10;
  undefined1 uVar11;
  int iVar12;
  size_t sVar13;
  State *pSVar14;
  uint uVar15;
  char cVar16;
  char *pcVar17;
  csubstr fmt;
  bool is_quoted;
  char msg [31];
  bool local_189;
  csubstr local_188;
  char local_178 [64];
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  char *pcStack_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  char *pcStack_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  char *pcStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  char *pcStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  pSVar14 = this->m_state;
  local_188.str = (pSVar14->line_contents).rem.str;
  local_188.len = (pSVar14->line_contents).rem.len;
  uVar15 = pSVar14->flags;
  if ((uVar15 & 0x40) != 0) {
    builtin_strncpy(local_178,"check failed: (has_none(RKEY))",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar1 = (code *)swi(3);
      uVar11 = (*pcVar1)();
      return (bool)uVar11;
    }
    local_48 = 0;
    uStack_40 = 0x6d80;
    local_38 = 0;
    pcStack_30 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_28 = 0x65;
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x6d80) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x6d80) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_178,0x1f,LVar2,(this->m_stack).m_callbacks.m_user_data);
    uVar15 = this->m_state->flags;
  }
  if ((~uVar15 & 0x18) != 0) {
    builtin_strncpy(local_178,"check failed: (has_all(RSEQ|FLOW))",0x23);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar1 = (code *)swi(3);
      uVar11 = (*pcVar1)();
      return (bool)uVar11;
    }
    local_70 = 0;
    uStack_68 = 0x6d81;
    local_60 = 0;
    pcStack_58 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_50 = 0x65;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6d81) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6d81) << 0x40,8);
    LVar3.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar3.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_178,0x23,LVar3,(this->m_stack).m_callbacks.m_user_data);
  }
  sVar13 = local_188.len;
  if (local_188.len != 0) {
    cVar16 = *local_188.str;
    if (cVar16 == ']') {
      _pop_level(this);
      _line_progressed(this,1);
      if ((this->m_state->flags & 0x2000) == 0) {
        return true;
      }
      _stop_seqimap(this);
      _pop_level(this);
      return true;
    }
    if (cVar16 == '#') {
      _scan_comment(this);
      return true;
    }
    if (cVar16 != ' ') goto LAB_001cac56;
    pSVar14 = this->m_state;
    if (((pSVar14->line_contents).rem.len == 0) || (*(pSVar14->line_contents).rem.str != ' ')) {
      builtin_strncpy(local_178 + 0x23,"ts.rem.begins_with(c))",0x17);
      builtin_strncpy(local_178,"check failed: (m_state->line_conten",0x23);
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      local_138 = 0;
      uStack_130 = 0x6d66;
      local_128 = 0;
      pcStack_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_118 = 0x65;
      LVar4.super_LineCol.col = 0;
      LVar4.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
      LVar4.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
      LVar4.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar4.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_178,0x3a,LVar4,(this->m_stack).m_callbacks.m_user_data);
      pSVar14 = this->m_state;
    }
    cVar16 = ' ';
LAB_001cac30:
    sVar13 = basic_substring<const_char>::first_not_of(&(pSVar14->line_contents).rem,cVar16,0);
    if (sVar13 == 0xffffffffffffffff) {
      sVar13 = (this->m_state->line_contents).rem.len;
    }
    goto LAB_001cb131;
  }
LAB_001cac56:
  pSVar14 = this->m_state;
  uVar15 = pSVar14->flags;
  if (-1 < (char)uVar15) {
    if ((uVar15 >> 8 & 1) == 0) {
      bVar10 = is_debugger_attached();
      if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      pcVar17 = "ERROR: internal error";
      sVar13 = 0x15;
      goto LAB_001cb08c;
    }
    if (local_188.len < 2) {
      if (local_188.len == 0) {
        iVar12 = basic_substring<const_char>::compare(&local_188,':');
        if (iVar12 == 0) goto LAB_001cb121;
      }
      else {
LAB_001caf4b:
        if (*local_188.str == ',') {
          if ((uVar15 & 0x10) == 0) {
            builtin_strncpy(local_178,"check failed: (has_all(FLOW))",0x1e);
            if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
              pcVar1 = (code *)swi(3);
              uVar11 = (*pcVar1)();
              return (bool)uVar11;
            }
            local_110 = 0;
            uStack_108 = 0x6e06;
            local_100 = 0;
            pcStack_f8 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_f0 = 0x65;
            LVar7.super_LineCol.col = 0;
            LVar7.super_LineCol.offset = SUB168(ZEXT816(0x6e06) << 0x40,0);
            LVar7.super_LineCol.line = SUB168(ZEXT816(0x6e06) << 0x40,8);
            LVar7.name.str =
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            LVar7.name.len = 0x65;
            (*(this->m_stack).m_callbacks.m_error)
                      (local_178,0x1e,LVar7,(this->m_stack).m_callbacks.m_user_data);
            pSVar14 = this->m_state;
            uVar15 = pSVar14->flags;
          }
          uVar15 = uVar15 & 0xfffffe7f | 0x80;
          goto LAB_001cb0da;
        }
        iVar12 = basic_substring<const_char>::compare(&local_188,':');
        if (iVar12 == 0) goto LAB_001cb121;
        if (((1 < sVar13) && (*local_188.str == ':')) && (local_188.str[1] == ' ')) {
LAB_001cb114:
          _start_seqimap(this);
          goto LAB_001cb2b7;
        }
      }
      bVar10 = is_debugger_attached();
      if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      pcVar17 = "ERROR: was expecting a comma";
      sVar13 = 0x1c;
      goto LAB_001cb08c;
    }
    if ((*local_188.str != ',') || (local_188.str[1] != ' ')) goto LAB_001caf4b;
    if ((uVar15 & 0x10) == 0) {
      builtin_strncpy(local_178,"check failed: (has_all(FLOW))",0x1e);
      if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
        pcVar1 = (code *)swi(3);
        uVar11 = (*pcVar1)();
        return (bool)uVar11;
      }
      local_e8 = 0;
      uStack_e0 = 0x6dfe;
      local_d8 = 0;
      pcStack_d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_c8 = 0x65;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x6dfe) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x6dfe) << 0x40,8);
      LVar6.name.str =
           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      LVar6.name.len = 0x65;
      (*(this->m_stack).m_callbacks.m_error)
                (local_178,0x1e,LVar6,(this->m_stack).m_callbacks.m_user_data);
      pSVar14 = this->m_state;
      uVar15 = pSVar14->flags;
    }
    pSVar14->flags = uVar15 & 0xfffffe7f | 0x80;
LAB_001cb2b7:
    sVar13 = 2;
    goto LAB_001cb131;
  }
  if ((uVar15 >> 8 & 1) != 0) {
    builtin_strncpy(local_178,"check failed: (has_none(RNXT))",0x1f);
    if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
      pcVar1 = (code *)swi(3);
      uVar11 = (*pcVar1)();
      return (bool)uVar11;
    }
    local_98 = 0;
    uStack_90 = 0x6da5;
    local_88 = 0;
    pcStack_80 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_78 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x6da5) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x6da5) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              (local_178,0x1f,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  bVar10 = _scan_scalar_seq_flow(this,&local_188,&local_189);
  sVar13 = local_188.len;
  pcVar17 = local_188.str;
  if (bVar10) {
    this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
    val.len = local_188.len;
    val.str = local_188.str;
    _append_val(this,val,(uint)local_189);
    return true;
  }
  if (local_188.len == 0) {
    iVar12 = basic_substring<const_char>::compare(&local_188,':');
    if (iVar12 != 0) goto LAB_001cb26a;
LAB_001cb121:
    _start_seqimap(this);
  }
  else {
    cVar16 = *local_188.str;
    if (cVar16 == '{') {
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,true);
      _start_map(this,true);
      pSVar14 = this->m_state;
      uVar15 = pSVar14->flags & 0xffffff2fU | 0x50;
LAB_001cb0da:
      pSVar14->flags = uVar15;
    }
    else {
      if (cVar16 != '[') {
        iVar12 = basic_substring<const_char>::compare(&local_188,':');
        if (iVar12 == 0) goto LAB_001cb121;
        if (sVar13 != 1) {
          if (cVar16 == '?') {
            if (pcVar17[1] == ' ') {
              _start_seqimap(this);
              _line_progressed(this,2);
              pSVar14 = this->m_state;
              uVar15 = pSVar14->flags;
              if (((uVar15 >> 9 & 1) == 0) ||
                 (iVar12 = basic_substring<const_char>::compare(&pSVar14->scalar,"",0), iVar12 != 0)
                 ) {
                builtin_strncpy(local_178,"check failed: (has_any(SSCL) && m_state->scalar == \"\")"
                                ,0x37);
                if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                  pcVar1 = (code *)swi(3);
                  uVar11 = (*pcVar1)();
                  return (bool)uVar11;
                }
                local_c0 = 0;
                uStack_b8 = 0x6dd5;
                local_b0 = 0;
                pcStack_a8 = 
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                local_a0 = 0x65;
                LVar8.super_LineCol.col = 0;
                LVar8.super_LineCol.offset = SUB168(ZEXT816(0x6dd5) << 0x40,0);
                LVar8.super_LineCol.line = SUB168(ZEXT816(0x6dd5) << 0x40,8);
                LVar8.name.str =
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                ;
                LVar8.name.len = 0x65;
                (*(this->m_stack).m_callbacks.m_error)
                          (local_178,0x37,LVar8,(this->m_stack).m_callbacks.m_user_data);
                pSVar14 = this->m_state;
                uVar15 = pSVar14->flags;
              }
              pSVar14->flags = uVar15 & 0xfffffd1f | 0x60;
              return true;
            }
          }
          else if ((cVar16 == ':') && (pcVar17[1] == ' ')) goto LAB_001cb114;
        }
LAB_001cb26a:
        bVar10 = _handle_types(this);
        if (bVar10) {
          return true;
        }
        bVar10 = _handle_val_anchors_and_refs(this);
        if (bVar10) {
          return true;
        }
        if (local_188.len < 2) {
          if (local_188.len != 0) goto LAB_001cb2c1;
        }
        else {
          if ((*local_188.str == ',') && (local_188.str[1] == ' ')) {
            _append_val_null(this,local_188.str + -1);
            goto LAB_001cb2b7;
          }
LAB_001cb2c1:
          if (*local_188.str == '\t') {
            pSVar14 = this->m_state;
            if (((pSVar14->line_contents).rem.len == 0) ||
               (*(pSVar14->line_contents).rem.str != '\t')) {
              builtin_strncpy(local_178 + 0x23,"ts.rem.begins_with(c))",0x17);
              builtin_strncpy(local_178,"check failed: (m_state->line_conten",0x23);
              if ((((byte)s_error_flags & 1) != 0) && (bVar10 = is_debugger_attached(), bVar10)) {
                pcVar1 = (code *)swi(3);
                uVar11 = (*pcVar1)();
                return (bool)uVar11;
              }
              local_138 = 0;
              uStack_130 = 0x6d66;
              local_128 = 0;
              pcStack_120 = 
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              local_118 = 0x65;
              LVar9.super_LineCol.col = 0;
              LVar9.super_LineCol.offset = SUB168(ZEXT816(0x6d66) << 0x40,0);
              LVar9.super_LineCol.line = SUB168(ZEXT816(0x6d66) << 0x40,8);
              LVar9.name.str =
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              ;
              LVar9.name.len = 0x65;
              (*(this->m_stack).m_callbacks.m_error)
                        (local_178,0x3a,LVar9,(this->m_stack).m_callbacks.m_user_data);
              pSVar14 = this->m_state;
            }
            cVar16 = '\t';
            goto LAB_001cac30;
          }
          if (*local_188.str == ',') {
            _append_val_null(this,local_188.str + -1);
            goto LAB_001cb129;
          }
        }
        bVar10 = is_debugger_attached();
        if ((bVar10) && (bVar10 = is_debugger_attached(), bVar10)) {
          pcVar1 = (code *)swi(3);
          uVar11 = (*pcVar1)();
          return (bool)uVar11;
        }
        pcVar17 = "ERROR: parse error";
        sVar13 = 0x12;
LAB_001cb08c:
        fmt.len = sVar13;
        fmt.str = pcVar17;
        _err<>(this,fmt);
        return true;
      }
      this->m_state->flags = this->m_state->flags & 0xfffffe7fU | 0x100;
      _push_level(this,true);
      _start_seq(this,true);
      this->m_state->flags = this->m_state->flags | 0x10;
    }
  }
LAB_001cb129:
  sVar13 = 1;
LAB_001cb131:
  _line_progressed(this,sVar13);
  return true;
}

Assistant:

bool Parser::_handle_seq_flow()
{
    _c4dbgpf("handle_seq_flow: node_id={} level={}", m_state->node_id, m_state->level);
    csubstr rem = m_state->line_contents.rem;

    _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RKEY));
    _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(RSEQ|FLOW));

    if(rem.begins_with(' '))
    {
        // with explicit flow, indentation does not matter
        _c4dbgp("starts with spaces");
        _skipchars(' ');
        return true;
    }
    _RYML_WITH_TAB_TOKENS(else if(rem.begins_with('\t'))
    {
        _c4dbgp("starts with tabs");
        _skipchars('\t');
        return true;
    })
    else if(rem.begins_with('#'))
    {
        _c4dbgp("it's a comment");
        rem = _scan_comment(); // also progresses the line
        return true;
    }
    else if(rem.begins_with(']'))
    {
        _c4dbgp("end the sequence");
        _pop_level();
        _line_progressed(1);
        if(has_all(RSEQIMAP))
        {
            _stop_seqimap();
            _pop_level();
        }
        return true;
    }

    if(has_any(RVAL))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RNXT));
        bool is_quoted;
        if(_scan_scalar_seq_flow(&rem, &is_quoted))
        {
            _c4dbgp("it's a scalar");
            addrem_flags(RNXT, RVAL);
            _append_val(rem, is_quoted);
            return true;
        }
        else if(rem.begins_with('['))
        {
            _c4dbgp("val is a child seq");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_seq();
            add_flags(FLOW);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('{'))
        {
            _c4dbgp("val is a child map");
            addrem_flags(RNXT, RVAL); // before _push_level!
            _push_level(/*explicit flow*/true);
            _start_map();
            addrem_flags(FLOW|RKEY, RVAL);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with("? "))
        {
            _c4dbgpf("found '? ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_any(SSCL) && m_state->scalar == "");
            addrem_flags(QMRK|RKEY, RVAL|SSCL);
            return true;
        }
        else if(_handle_types())
        {
            return true;
        }
        else if(_handle_val_anchors_and_refs())
        {
            return true;
        }
        else if(rem.begins_with(", "))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _c4dbgp("found ',' -- the value was null");
            _append_val_null(rem.str - 1);
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with('\t'))
        {
            _skipchars('\t');
            return true;
        }
        else
        {
            _c4err("parse error");
        }
    }
    else if(has_any(RNXT))
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RVAL));
        if(rem.begins_with(", "))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(2);
            return true;
        }
        else if(rem.begins_with(','))
        {
            _RYML_CB_ASSERT(m_stack.m_callbacks, has_all(FLOW));
            _c4dbgp("seq: expect next val");
            addrem_flags(RVAL, RNXT);
            _line_progressed(1);
            return true;
        }
        else if(rem == ':')
        {
            _c4dbgpf("found ':' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(1);
            return true;
        }
        else if(rem.begins_with(": ") _RYML_WITH_TAB_TOKENS( || rem.begins_with(":\t")))
        {
            _c4dbgpf("found ': ' -- there's an implicit map in the seq node[{}]", m_state->node_id);
            _start_seqimap();
            _line_progressed(2);
            return true;
        }
        else
        {
            _c4err("was expecting a comma");
        }
    }
    else
    {
        _c4err("internal error");
    }

    return true;
}